

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O1

void __thiscall btMatrix3x3::getRotation(btMatrix3x3 *this,btQuaternion *q)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float local_48 [4];
  btQuaternion *local_38;
  ulong uVar5;
  
  fVar10 = this->m_el[0].m_floats[0];
  fVar1 = this->m_el[1].m_floats[1];
  fVar2 = this->m_el[2].m_floats[2];
  fVar9 = fVar10 + fVar1 + fVar2;
  if (fVar9 <= 0.0) {
    uVar3 = (uint)(fVar10 < fVar2) * 2;
    if (fVar10 < fVar1) {
      uVar3 = (fVar1 < fVar2) + 1;
    }
    iVar6 = 0;
    if (uVar3 + 1 != 3) {
      iVar6 = uVar3 + 1;
    }
    uVar4 = ((uVar3 + 2) / 3) * -3 + uVar3 + 2;
    uVar5 = (ulong)uVar4;
    uVar8 = (ulong)uVar3;
    lVar7 = (long)iVar6;
    fVar10 = ((*(float *)((long)this->m_el + uVar8 * 0x14) -
              *(float *)((long)this->m_el + lVar7 * 0x14)) -
             *(float *)((long)this->m_el[0].m_floats + uVar5 * 4 + (ulong)(uVar4 * 0x10))) + 1.0;
    if (fVar10 < 0.0) {
      local_38 = q;
      fVar10 = sqrtf(fVar10);
      q = local_38;
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    local_48[uVar8] = fVar10 * 0.5;
    fVar10 = 0.5 / fVar10;
    local_48[3] = (*(float *)((long)this->m_el[0].m_floats + lVar7 * 4 + (ulong)(uVar4 * 0x10)) -
                  this->m_el[lVar7].m_floats[uVar5]) * fVar10;
    local_48[lVar7] =
         (this->m_el[lVar7].m_floats[uVar8] + this->m_el[uVar8].m_floats[lVar7]) * fVar10;
    local_48[uVar5] =
         (*(float *)((long)this->m_el[0].m_floats + uVar8 * 4 + (ulong)(uVar4 * 0x10)) +
         this->m_el[uVar8].m_floats[uVar5]) * fVar10;
  }
  else {
    fVar9 = fVar9 + 1.0;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    fVar10 = 0.5 / fVar9;
    local_48[0] = (this->m_el[2].m_floats[1] - this->m_el[1].m_floats[2]) * fVar10;
    local_48[1] = (this->m_el[0].m_floats[2] - this->m_el[2].m_floats[0]) * fVar10;
    local_48[2] = (this->m_el[1].m_floats[0] - this->m_el[0].m_floats[1]) * fVar10;
    local_48[3] = fVar9 * 0.5;
  }
  *(ulong *)(q->super_btQuadWord).m_floats = CONCAT44(local_48[1],local_48[0]);
  *(ulong *)((q->super_btQuadWord).m_floats + 2) = CONCAT44(local_48[3],local_48[2]);
  return;
}

Assistant:

void getRotation(btQuaternion& q) const
	{
#if (defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE))|| defined (BT_USE_NEON)
        btScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();
        btScalar s, x;
        
        union {
            btSimdFloat4 vec;
            btScalar f[4];
        } temp;
        
        if (trace > btScalar(0.0)) 
        {
            x = trace + btScalar(1.0);

            temp.f[0]=m_el[2].y() - m_el[1].z();
            temp.f[1]=m_el[0].z() - m_el[2].x();
            temp.f[2]=m_el[1].x() - m_el[0].y();
            temp.f[3]=x;
            //temp.f[3]= s * btScalar(0.5);
        } 
        else 
        {
            int i, j, k;
            if(m_el[0].x() < m_el[1].y()) 
            { 
                if( m_el[1].y() < m_el[2].z() )
                    { i = 2; j = 0; k = 1; }
                else
                    { i = 1; j = 2; k = 0; }
            }
            else
            {
                if( m_el[0].x() < m_el[2].z())
                    { i = 2; j = 0; k = 1; }
                else
                    { i = 0; j = 1; k = 2; }
            }

            x = m_el[i][i] - m_el[j][j] - m_el[k][k] + btScalar(1.0);

            temp.f[3] = (m_el[k][j] - m_el[j][k]);
            temp.f[j] = (m_el[j][i] + m_el[i][j]);
            temp.f[k] = (m_el[k][i] + m_el[i][k]);
            temp.f[i] = x;
            //temp.f[i] = s * btScalar(0.5);
        }

        s = btSqrt(x);
        q.set128(temp.vec);
        s = btScalar(0.5) / s;

        q *= s;
#else    
		btScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();

		btScalar temp[4];

		if (trace > btScalar(0.0)) 
		{
			btScalar s = btSqrt(trace + btScalar(1.0));
			temp[3]=(s * btScalar(0.5));
			s = btScalar(0.5) / s;

			temp[0]=((m_el[2].y() - m_el[1].z()) * s);
			temp[1]=((m_el[0].z() - m_el[2].x()) * s);
			temp[2]=((m_el[1].x() - m_el[0].y()) * s);
		} 
		else 
		{
			int i = m_el[0].x() < m_el[1].y() ? 
				(m_el[1].y() < m_el[2].z() ? 2 : 1) :
				(m_el[0].x() < m_el[2].z() ? 2 : 0); 
			int j = (i + 1) % 3;  
			int k = (i + 2) % 3;

			btScalar s = btSqrt(m_el[i][i] - m_el[j][j] - m_el[k][k] + btScalar(1.0));
			temp[i] = s * btScalar(0.5);
			s = btScalar(0.5) / s;

			temp[3] = (m_el[k][j] - m_el[j][k]) * s;
			temp[j] = (m_el[j][i] + m_el[i][j]) * s;
			temp[k] = (m_el[k][i] + m_el[i][k]) * s;
		}
		q.setValue(temp[0],temp[1],temp[2],temp[3]);
#endif
	}